

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffpcln(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **array,void **nulval,int *status)

{
  char local_908 [8];
  char errmsg [100];
  char *array1;
  LONGLONG nelem1;
  int icol_1;
  LONGLONG width;
  LONGLONG repeat;
  int typecode;
  int icol;
  size_t sizes [255];
  LONGLONG *repeats;
  long nrowbuf;
  LONGLONG currow;
  LONGLONG nwrite;
  LONGLONG ndone;
  LONGLONG ntotrows;
  LONGLONG nrows_local;
  LONGLONG firstrow_local;
  int *colnum_local;
  int *datatype_local;
  fitsfile *pfStack_18;
  int ncols_local;
  fitsfile *fptr_local;
  
  sizes[0xfe] = 0;
  ntotrows = nrows;
  nrows_local = firstrow;
  firstrow_local = (LONGLONG)colnum;
  colnum_local = datatype;
  datatype_local._4_4_ = ncols;
  pfStack_18 = fptr;
  memset(&typecode,0,0x7f8);
  sizes[0xd] = 1;
  sizes[0xb] = 1;
  sizes[10] = 1;
  sizes[0x14] = 2;
  sizes[0x13] = 2;
  sizes[0x1d] = 4;
  sizes[0x1e] = 4;
  sizes[0x27] = 8;
  sizes[0x28] = 8;
  sizes[0x4f] = 8;
  sizes[0x50] = 8;
  sizes[0x29] = 4;
  sizes[0x51] = 8;
  sizes[0xa2] = 0x10;
  if (*status < 1) {
    if (datatype_local._4_4_ < 1) {
      *status = 0;
      fptr_local._4_4_ = 0;
    }
    else {
      sizes[0xfe] = (size_t)malloc((long)datatype_local._4_4_ << 3);
      if ((void *)sizes[0xfe] == (void *)0x0) {
        *status = 0x71;
        fptr_local._4_4_ = 0x71;
      }
      else {
        ffgnrwll(pfStack_18,&ndone,status);
        ffgrsz(pfStack_18,(long *)&repeats,status);
        for (repeat._4_4_ = 0; repeat._4_4_ < datatype_local._4_4_ && repeat._4_4_ < 1000;
            repeat._4_4_ = repeat._4_4_ + 1) {
          ffgtclll(pfStack_18,*(int *)(firstrow_local + (long)repeat._4_4_ * 4),(int *)&repeat,
                   &width,(LONGLONG *)&stack0xfffffffffffff780,status);
          *(LONGLONG *)(sizes[0xfe] + (long)repeat._4_4_ * 8) = width;
          if (((colnum_local[repeat._4_4_] == 1) || (colnum_local[repeat._4_4_] == 0x10)) ||
             (*(long *)(&typecode + (long)colnum_local[repeat._4_4_] * 2) == 0)) {
            ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
            *status = 0x19a;
          }
          if ((int)repeat < 0) {
            ffpmsg("Cannot write to variable-length data (ffpcln)");
            *status = 0x140;
          }
          if (*status != 0) break;
        }
        if (*status == 0) {
          if (datatype_local._4_4_ == 1) {
            ffpcn(pfStack_18,*colnum_local,*(int *)firstrow_local,nrows_local,1,
                  ntotrows * *(long *)sizes[0xfe],*array,*nulval,status);
            free((void *)sizes[0xfe]);
            fptr_local._4_4_ = *status;
          }
          else {
            nrowbuf = nrows_local;
            for (nwrite = 0; nwrite < ntotrows; nwrite = currow + nwrite) {
              currow = ntotrows - nwrite;
              if ((long)repeats < ntotrows - nwrite) {
                currow = (LONGLONG)repeats;
              }
              for (nelem1._4_4_ = 0; nelem1._4_4_ < datatype_local._4_4_;
                  nelem1._4_4_ = nelem1._4_4_ + 1) {
                ffpcn(pfStack_18,colnum_local[nelem1._4_4_],
                      *(int *)(firstrow_local + (long)nelem1._4_4_ * 4),nwrite + 1,1,
                      currow * *(long *)(sizes[0xfe] + (long)nelem1._4_4_ * 8),
                      (void *)((long)array[nelem1._4_4_] +
                              *(long *)(sizes[0xfe] + (long)nelem1._4_4_ * 8) * nwrite *
                              *(long *)(&typecode + (long)colnum_local[nelem1._4_4_] * 2)),
                      nulval[nelem1._4_4_],status);
                if (*status != 0) {
                  sprintf(local_908,"Failed to write column %d data rows %lld-%lld (ffpcln)",
                          (ulong)*(uint *)(firstrow_local + (long)nelem1._4_4_ * 4),nrowbuf,
                          nrowbuf + currow + -1);
                  ffpmsg(local_908);
                  break;
                }
              }
              if (*status != 0) break;
              nrowbuf = currow + nrowbuf;
            }
            free((void *)sizes[0xfe]);
            fptr_local._4_4_ = *status;
          }
        }
        else {
          free((void *)sizes[0xfe]);
          fptr_local._4_4_ = *status;
        }
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpcln( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to write              */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to write (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to write (1 = 1st row)    */
            LONGLONG nrows,       /* I - number of rows to write             */
            void **array,     /* I - array of pointers to values to write    */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            int  *status)     /* IO - error status                           */
/*
  Write arrays of values to NCOLS table columns. This is an optimization
  to write all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
  Undefined elements for column i that are equal to *(nulval[i]) are set to
  the defined null value, unless nulval[i]=0,
  in which case no checking for undefined values will be performed.
*/
{
    LONGLONG ntotrows, ndone, nwrite, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot write to variable-length data (ffpcln)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_write_colnull(fptr, datatype[0], colnum[0], firstrow, 1,
			 nrows*repeats[0], 
			 array[0], nulval[0], status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nwrite = (nrows-ndone);
      if (nwrite > nrowbuf) nwrite = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nwrite*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_write_colnull(fptr, datatype[icol], colnum[icol], ndone+1, 1, 
			   nelem1, array1, nulval[icol], status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg,
		  "Failed to write column %d data rows %lld-%lld (ffpcln)",
		  colnum[icol], currow, currow+nwrite-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nwrite;
      ndone += nwrite;
    }

    free(repeats);
    return *status;
}